

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audit.cpp
# Opt level: O1

ssize_t __thiscall
Vault::Sys::Audit::read_abi_cxx11_(Audit *this,int __fd,void *__buf,size_t __nbytes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  undefined4 in_register_00000034;
  Path local_58;
  Url local_38;
  
  client = *(Client **)CONCAT44(in_register_00000034,__fd);
  paVar1 = &local_58.value_.field_2;
  local_58.value_.field_2._8_8_ = 0;
  local_58.value_._M_string_length = 0;
  local_58.value_.field_2._M_allocated_capacity = 0;
  local_58.value_._M_dataplus._M_p = (pointer)paVar1;
  getUrl(&local_38,(Audit *)CONCAT44(in_register_00000034,__fd),&local_58);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.value_._M_dataplus._M_p != &local_38.value_.field_2) {
    operator_delete(local_38.value_._M_dataplus._M_p,
                    local_38.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.value_._M_dataplus._M_p,
                    local_58.value_.field_2._M_allocated_capacity + 1);
  }
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Audit::read() {
  return HttpConsumer::get(client_, getUrl(Path{}));
}